

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O2

void __thiscall
syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_NE_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_NE_Test *this)

{
  Fixed *pFVar1;
  int *in_R9;
  int x;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  x = 1;
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  iutest::internal::CmpHelperNE<int,int>
            (&iutest_ar,(internal *)0x30c9ec,"x",(char *)&local_190,&x,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,x);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0x7e,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = 1;
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
    iutest::internal::CmpHelperNE<int,int>
              (&iutest_ar,(internal *)0x30c9ec,"x",(char *)&local_190,&x,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,x);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x80,iutest_ar.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = 1;
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
    iutest::internal::CmpHelperNE<int,int>
              (&iutest_ar,(internal *)0x30c9ec,"x",(char *)&local_190,&x,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,x);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x82,iutest_ar.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = 1;
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
    iutest::internal::CmpHelperNE<int,int>
              (&iutest_ar,(internal *)0x30c9ec,"x",(char *)&local_190,&x,in_R9);
    if (iutest_ar.m_result != false) goto LAB_002f65eb;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,x);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0x84,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002f65eb:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

TEST(GTestSyntaxTest, NE)
{
    if( int x = 1 )
        ASSERT_NE(0, x) << x;
    if( int x = 1 )
        EXPECT_NE(0, x) << x;
    if( int x = 1 )
        INFORM_NE(0, x) << x;
    if( int x = 1 )
        ASSUME_NE(0, x) << x;
}